

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O1

void ff_fma(flexfloat_t *dest,flexfloat_t *a,flexfloat_t *b,flexfloat_t *c)

{
  int iVar1;
  double dVar2;
  fexcept_t flags;
  fexcept_t local_32;
  
  iVar1 = fegetround();
  if (iVar1 == 0 && (a->desc).frac_bits < 0x34) {
    if ((long)((ulong)b->value ^ (ulong)c->value ^ (ulong)a->value) < 0) {
      fesetround(0xc00);
    }
    else {
      fegetexceptflag(&local_32,0x3d);
      dVar2 = fma(a->value,b->value,c->value);
      fesetround((uint)(0.0 <= dVar2) * 0x400 + 0x400);
      fesetexceptflag(&local_32,0x3d);
    }
  }
  dVar2 = fma(a->value,b->value,c->value);
  dest->value = dVar2;
  if ((a->desc).frac_bits < 0x34 && iVar1 == 0) {
    fesetround(0);
  }
  flexfloat_sanitize(dest);
  return;
}

Assistant:

INLINE void ff_fma(flexfloat_t *dest, const flexfloat_t *a, const flexfloat_t *b, const flexfloat_t *c) {
    assert((dest->desc.exp_bits == a->desc.exp_bits) && (dest->desc.frac_bits == a->desc.frac_bits) &&
           (a->desc.exp_bits == b->desc.exp_bits) && (a->desc.frac_bits == b->desc.frac_bits) &&
           (b->desc.exp_bits == c->desc.exp_bits) && (b->desc.frac_bits == c->desc.frac_bits));
    #ifdef FLEXFLOAT_ROUNDING
    // Change the rounding mode according to the error direction if we need to do manual rounding for RNE
    int mode = fegetround();
    bool eff_sub = flexfloat_sign(a) ^ flexfloat_sign(b) ^ flexfloat_sign(c);
    if (a->desc.frac_bits < NUM_BITS_FRAC && mode == FE_TONEAREST) {
        if (!eff_sub) { // in this case, we need to round away from zero
            fexcept_t flags;
            fegetexceptflag(&flags, FE_ALL_EXCEPT); // get accrued flags to not tarnish them here
            double try = fma(a->value, b->value, c->value);
            (try >= 0) ? fesetround(FE_UPWARD) : fesetround(FE_DOWNWARD);
            fesetexceptflag(&flags, FE_ALL_EXCEPT); // restore flags here
        } else {
            fesetround(FE_TOWARDZERO); // just truncate
        }
    }
    #endif
    dest->value = fma(a->value, b->value, c->value); // finally the actual operation
    #ifdef FLEXFLOAT_TRACKING
    dest->exact_value = fma(a->exact_value, b->exact_value, c->exact_value);
    if(dest->tracking_fn) (dest->tracking_fn)(dest, dest->tracking_arg);
    #endif
    #ifdef FLEXFLOAT_ROUNDING
    if (a->desc.frac_bits < NUM_BITS_FRAC && mode == FE_TONEAREST)
        fesetround(FE_TONEAREST); // restore rounding
    #endif
    flexfloat_sanitize(dest);
    #ifdef FLEXFLOAT_STATS
    if(StatsEnabled) getOpStats(dest->desc)->fma += 1;
    #endif
}